

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O3

void SectionHdrWrapper::initSecCharacter
               (map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
                *secHdrCharact)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  mapped_type *pmVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  key_type_conflict2 local_34;
  QArrayData *local_30;
  char16_t *local_28;
  qsizetype local_20;
  
  local_34 = 0x40000000;
  pmVar4 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_34);
  QVar5.m_data = (storage_type *)0x8;
  QVar5.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar5);
  pQVar1 = &((pmVar4->d).d)->super_QArrayData;
  (pmVar4->d).d = (Data *)local_30;
  pcVar2 = (pmVar4->d).ptr;
  (pmVar4->d).ptr = local_28;
  qVar3 = (pmVar4->d).size;
  (pmVar4->d).size = local_20;
  local_30 = pQVar1;
  local_28 = pcVar2;
  local_20 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  local_34 = 0x80000000;
  pmVar4 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_34);
  QVar6.m_data = (storage_type *)0x9;
  QVar6.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar6);
  pQVar1 = &((pmVar4->d).d)->super_QArrayData;
  (pmVar4->d).d = (Data *)local_30;
  pcVar2 = (pmVar4->d).ptr;
  (pmVar4->d).ptr = local_28;
  qVar3 = (pmVar4->d).size;
  (pmVar4->d).size = local_20;
  local_30 = pQVar1;
  local_28 = pcVar2;
  local_20 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  local_34 = 0x20000000;
  pmVar4 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_34);
  QVar7.m_data = (storage_type *)0xa;
  QVar7.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar7);
  pQVar1 = &((pmVar4->d).d)->super_QArrayData;
  (pmVar4->d).d = (Data *)local_30;
  pcVar2 = (pmVar4->d).ptr;
  (pmVar4->d).ptr = local_28;
  qVar3 = (pmVar4->d).size;
  (pmVar4->d).size = local_20;
  local_30 = pQVar1;
  local_28 = pcVar2;
  local_20 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  local_34 = 0x1000000;
  pmVar4 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_34);
  QVar8.m_data = (storage_type *)0x1d;
  QVar8.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar8);
  pQVar1 = &((pmVar4->d).d)->super_QArrayData;
  (pmVar4->d).d = (Data *)local_30;
  pcVar2 = (pmVar4->d).ptr;
  (pmVar4->d).ptr = local_28;
  qVar3 = (pmVar4->d).size;
  (pmVar4->d).size = local_20;
  local_30 = pQVar1;
  local_28 = pcVar2;
  local_20 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  local_34 = 0x2000000;
  pmVar4 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_34);
  QVar9.m_data = (storage_type *)0xb;
  QVar9.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar9);
  pQVar1 = &((pmVar4->d).d)->super_QArrayData;
  (pmVar4->d).d = (Data *)local_30;
  pcVar2 = (pmVar4->d).ptr;
  (pmVar4->d).ptr = local_28;
  qVar3 = (pmVar4->d).size;
  (pmVar4->d).size = local_20;
  local_30 = pQVar1;
  local_28 = pcVar2;
  local_20 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  local_34 = 0x4000000;
  pmVar4 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_34);
  QVar10.m_data = (storage_type *)0xc;
  QVar10.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar10);
  pQVar1 = &((pmVar4->d).d)->super_QArrayData;
  (pmVar4->d).d = (Data *)local_30;
  pcVar2 = (pmVar4->d).ptr;
  (pmVar4->d).ptr = local_28;
  qVar3 = (pmVar4->d).size;
  (pmVar4->d).size = local_20;
  local_30 = pQVar1;
  local_28 = pcVar2;
  local_20 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  local_34 = 0x8000000;
  pmVar4 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_34);
  QVar11.m_data = (storage_type *)0xc;
  QVar11.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar11);
  pQVar1 = &((pmVar4->d).d)->super_QArrayData;
  (pmVar4->d).d = (Data *)local_30;
  pcVar2 = (pmVar4->d).ptr;
  (pmVar4->d).ptr = local_28;
  qVar3 = (pmVar4->d).size;
  (pmVar4->d).size = local_20;
  local_30 = pQVar1;
  local_28 = pcVar2;
  local_20 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  local_34 = 0x10000000;
  pmVar4 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_34);
  QVar12.m_data = (storage_type *)0x9;
  QVar12.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar12);
  pQVar1 = &((pmVar4->d).d)->super_QArrayData;
  (pmVar4->d).d = (Data *)local_30;
  pcVar2 = (pmVar4->d).ptr;
  (pmVar4->d).ptr = local_28;
  qVar3 = (pmVar4->d).size;
  (pmVar4->d).size = local_20;
  local_30 = pQVar1;
  local_28 = pcVar2;
  local_20 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  local_34 = 0x20;
  pmVar4 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_34);
  QVar13.m_data = (storage_type *)0x4;
  QVar13.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar13);
  pQVar1 = &((pmVar4->d).d)->super_QArrayData;
  (pmVar4->d).d = (Data *)local_30;
  pcVar2 = (pmVar4->d).ptr;
  (pmVar4->d).ptr = local_28;
  qVar3 = (pmVar4->d).size;
  (pmVar4->d).size = local_20;
  local_30 = pQVar1;
  local_28 = pcVar2;
  local_20 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  local_34 = 0x40;
  pmVar4 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_34);
  QVar14.m_data = (storage_type *)0x10;
  QVar14.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar14);
  pQVar1 = &((pmVar4->d).d)->super_QArrayData;
  (pmVar4->d).d = (Data *)local_30;
  pcVar2 = (pmVar4->d).ptr;
  (pmVar4->d).ptr = local_28;
  qVar3 = (pmVar4->d).size;
  (pmVar4->d).size = local_20;
  local_30 = pQVar1;
  local_28 = pcVar2;
  local_20 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  local_34 = 0x80;
  pmVar4 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_34);
  QVar15.m_data = (storage_type *)0x12;
  QVar15.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar15);
  pQVar1 = &((pmVar4->d).d)->super_QArrayData;
  (pmVar4->d).d = (Data *)local_30;
  pcVar2 = (pmVar4->d).ptr;
  (pmVar4->d).ptr = local_28;
  qVar3 = (pmVar4->d).size;
  (pmVar4->d).size = local_20;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      local_30 = pQVar1;
      local_28 = pcVar2;
      local_20 = qVar3;
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  return;
}

Assistant:

void SectionHdrWrapper::initSecCharacter(std::map<DWORD, QString> &secHdrCharact)
{
    secHdrCharact[SCN_MEM_READ] = "readable";
    secHdrCharact[SCN_MEM_WRITE] = "writeable";
    secHdrCharact[SCN_MEM_EXECUTE] = "executable";

    secHdrCharact[SCN_LNK_NRELOC_OVFL] = "contains extended relocations";
    secHdrCharact[SCN_MEM_DISCARDABLE] = "discardable";
    secHdrCharact[SCN_MEM_NOT_CACHED] = "not cachable";
    secHdrCharact[SCN_MEM_NOT_PAGED] = "non-pageable";
    secHdrCharact[SCN_MEM_SHARED] = "shareable";
    secHdrCharact[SCN_CNT_CODE] = "code";
    secHdrCharact[SCN_CNT_INITIALIZED_DATA] = "initialized data";
    secHdrCharact[SCN_CNT_UNINITIALIZED_DATA] = "uninitialized data";
}